

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textreader.hpp
# Opt level: O0

uint32_t __thiscall TextReader::read_uint32(TextReader *this,uint32_t min_value,uint32_t max_value)

{
  bool bVar1;
  char *pcVar2;
  long lVar3;
  allocator local_151;
  string local_150 [32];
  __cxx11 local_130 [39];
  allocator local_109;
  string local_108 [32];
  __cxx11 local_e8 [55];
  allocator local_b1;
  string local_b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50 [36];
  int local_2c;
  ulong uStack_28;
  int index;
  uint64_t result;
  uint32_t max_value_local;
  uint32_t min_value_local;
  TextReader *this_local;
  
  result._0_4_ = max_value;
  result._4_4_ = min_value;
  _max_value_local = this;
  load_next_token(this);
  if (this->current_token_type_ == ttDec) {
    uStack_28 = 0;
    for (local_2c = 0; (ulong)(long)local_2c < this->current_token_len_; local_2c = local_2c + 1) {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)&this->current_line_);
      bVar1 = false;
      if ('/' < *pcVar2) {
        pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)&this->current_line_);
        bVar1 = *pcVar2 < ':';
      }
      if (!bVar1) {
        __assert_fail("_is_digit(current_line_[current_token_pos_ + index])",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/vsklad[P]cgraph/bal/io/textreader.hpp"
                      ,0x170,"uint32_t TextReader::read_uint32(const uint32_t, const uint32_t)");
      }
      lVar3 = uStack_28 * 10;
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)&this->current_line_);
      uStack_28 = lVar3 + (*pcVar2 + -0x30);
      if ((uStack_28 < result._4_4_) || ((uint32_t)result < uStack_28)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_b0,"The unsigned int 32 bit value is out of bounds: ",&local_b1);
        std::__cxx11::to_string(local_e8,result._4_4_);
        std::operator+(local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_b0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_108,"..",&local_109);
        std::operator+(local_70,local_90);
        std::__cxx11::to_string(local_130,(uint32_t)result);
        std::operator+(local_50,local_70);
        parse_error(this,local_50);
        std::__cxx11::string::~string((string *)local_50);
        std::__cxx11::string::~string((string *)local_130);
        std::__cxx11::string::~string((string *)local_70);
        std::__cxx11::string::~string(local_108);
        std::allocator<char>::~allocator((allocator<char> *)&local_109);
        std::__cxx11::string::~string((string *)local_90);
        std::__cxx11::string::~string((string *)local_e8);
        std::__cxx11::string::~string(local_b0);
        std::allocator<char>::~allocator((allocator<char> *)&local_b1);
      }
    }
    skip_token(this);
    this_local._4_4_ = (uint32_t)uStack_28;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_150,"Expect an unsigned int 32 bit value",&local_151);
    parse_error(this,(string *)local_150);
    std::__cxx11::string::~string(local_150);
    std::allocator<char>::~allocator((allocator<char> *)&local_151);
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

inline uint32_t read_uint32(const uint32_t min_value = 0, const uint32_t max_value = UINT32_MAX) {
        load_next_token();
        if (current_token_type_ == ttDec) {
            uint64_t result = 0;
            auto index = 0;
            while (index < current_token_len_) {
                // this is checked when parsing the token already
                assert(_is_digit(current_line_[current_token_pos_ + index]));
                result = result * 10 + (current_line_[current_token_pos_ + index] - '0');
                if (result < min_value || result > max_value) {
                    parse_error(std::string("The unsigned int 32 bit value is out of bounds: ") +
                                std::to_string(min_value) + std::string("..") + std::to_string(max_value));
                };
                index++;
            };
            skip_token();
            return (uint32_t)result;
        };
        parse_error("Expect an unsigned int 32 bit value");
        return 0;
    }